

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Backup.cpp
# Opt level: O1

void __thiscall
SQLite::Backup::Backup
          (Backup *this,Database *aDestDatabase,char *apDestDatabaseName,Database *aSrcDatabase,
          char *apSrcDatabaseName)

{
  sqlite3_backup *__p;
  Exception *this_00;
  
  (this->mpSQLiteBackup)._M_t.super___uniq_ptr_impl<sqlite3_backup,_SQLite::Backup::Deleter>._M_t.
  super__Tuple_impl<0UL,_sqlite3_backup_*,_SQLite::Backup::Deleter>.
  super__Head_base<0UL,_sqlite3_backup_*,_false>._M_head_impl = (sqlite3_backup *)0x0;
  __p = sqlite3_backup_init((aDestDatabase->mSQLitePtr)._M_t.
                            super___uniq_ptr_impl<sqlite3,_SQLite::Database::Deleter>._M_t.
                            super__Tuple_impl<0UL,_sqlite3_*,_SQLite::Database::Deleter>.
                            super__Head_base<0UL,_sqlite3_*,_false>._M_head_impl,apDestDatabaseName,
                            (aSrcDatabase->mSQLitePtr)._M_t.
                            super___uniq_ptr_impl<sqlite3,_SQLite::Database::Deleter>._M_t.
                            super__Tuple_impl<0UL,_sqlite3_*,_SQLite::Database::Deleter>.
                            super__Head_base<0UL,_sqlite3_*,_false>._M_head_impl,apSrcDatabaseName);
  std::__uniq_ptr_impl<sqlite3_backup,_SQLite::Backup::Deleter>::reset
            ((__uniq_ptr_impl<sqlite3_backup,_SQLite::Backup::Deleter> *)this,__p);
  if ((this->mpSQLiteBackup)._M_t.super___uniq_ptr_impl<sqlite3_backup,_SQLite::Backup::Deleter>.
      _M_t.super__Tuple_impl<0UL,_sqlite3_backup_*,_SQLite::Backup::Deleter>.
      super__Head_base<0UL,_sqlite3_backup_*,_false>._M_head_impl != (sqlite3_backup *)0x0) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception
            (this_00,(aDestDatabase->mSQLitePtr)._M_t.
                     super___uniq_ptr_impl<sqlite3,_SQLite::Database::Deleter>._M_t.
                     super__Tuple_impl<0UL,_sqlite3_*,_SQLite::Database::Deleter>.
                     super__Head_base<0UL,_sqlite3_*,_false>._M_head_impl);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Backup::Backup(Database&    aDestDatabase,
               const char*  apDestDatabaseName,
               Database&    aSrcDatabase,
               const char*  apSrcDatabaseName)
{
    mpSQLiteBackup.reset(sqlite3_backup_init(aDestDatabase.getHandle(),
                                         apDestDatabaseName,
                                         aSrcDatabase.getHandle(),
                                         apSrcDatabaseName));
    if (nullptr == mpSQLiteBackup)
    {
        // If an error occurs, the error code and message are attached to the destination database connection.
        throw SQLite::Exception(aDestDatabase.getHandle());
    }
}